

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O1

void __thiscall soul::SourceCodeOperations::clear(SourceCodeOperations *this)

{
  pointer pMVar1;
  pointer pMVar2;
  SourceCodeText *o;
  pointer pMVar3;
  
  (this->topLevelNamespace).object = (Namespace *)0x0;
  pMVar1 = (this->allModules).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->allModules).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar3 = pMVar1;
  if (pMVar2 != pMVar1) {
    do {
      ModuleDeclaration::~ModuleDeclaration(pMVar3);
      pMVar3 = pMVar3 + 1;
    } while (pMVar3 != pMVar2);
    (this->allModules).
    super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar1;
  }
  pMVar1 = (this->processors).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->processors).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar3 = pMVar1;
  if (pMVar2 != pMVar1) {
    do {
      ModuleDeclaration::~ModuleDeclaration(pMVar3);
      pMVar3 = pMVar3 + 1;
    } while (pMVar3 != pMVar2);
    (this->processors).
    super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar1;
  }
  pMVar1 = (this->graphs).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->graphs).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar3 = pMVar1;
  if (pMVar2 != pMVar1) {
    do {
      ModuleDeclaration::~ModuleDeclaration(pMVar3);
      pMVar3 = pMVar3 + 1;
    } while (pMVar3 != pMVar2);
    (this->graphs).
    super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar1;
  }
  pMVar1 = (this->namespaces).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->namespaces).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar3 = pMVar1;
  if (pMVar2 != pMVar1) {
    do {
      ModuleDeclaration::~ModuleDeclaration(pMVar3);
      pMVar3 = pMVar3 + 1;
    } while (pMVar3 != pMVar2);
    (this->namespaces).
    super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar1;
  }
  o = (this->source).sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (this->source).sourceCode.object = (SourceCodeText *)0x0;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  }
  (this->source).location.data = (char *)0x0;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
  PoolAllocator::clear(&(this->allocator).pool);
  std::
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_M_erase_at_end(&(this->allocator).identifiers.strings,
                    (this->allocator).identifiers.strings.
                    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void SourceCodeOperations::clear()
{
    topLevelNamespace.reset();
    allModules.clear();
    processors.clear();
    graphs.clear();
    namespaces.clear();
    source = {};
    allocator.clear();
}